

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# njd.c
# Opt level: O0

NJDNode * NJD_remove_node(NJD *njd,NJDNode *node)

{
  void *in_RSI;
  long *in_RDI;
  NJDNode *next;
  NJDNode *local_18;
  
  if ((in_RSI == (void *)*in_RDI) && (in_RSI == (void *)in_RDI[1])) {
    *in_RDI = 0;
    in_RDI[1] = 0;
    local_18 = (NJDNode *)0x0;
  }
  else if (in_RSI == (void *)*in_RDI) {
    *in_RDI = *(long *)((long)in_RSI + 0x70);
    *(undefined8 *)(*in_RDI + 0x68) = 0;
    local_18 = (NJDNode *)*in_RDI;
  }
  else if (in_RSI == (void *)in_RDI[1]) {
    in_RDI[1] = *(long *)((long)in_RSI + 0x68);
    *(undefined8 *)(in_RDI[1] + 0x70) = 0;
    local_18 = (NJDNode *)0x0;
  }
  else {
    *(undefined8 *)(*(long *)((long)in_RSI + 0x68) + 0x70) = *(undefined8 *)((long)in_RSI + 0x70);
    *(undefined8 *)(*(long *)((long)in_RSI + 0x70) + 0x68) = *(undefined8 *)((long)in_RSI + 0x68);
    local_18 = *(NJDNode **)((long)in_RSI + 0x70);
  }
  NJDNode_clear((NJDNode *)0x17f675);
  free(in_RSI);
  return local_18;
}

Assistant:

NJDNode *NJD_remove_node(NJD * njd, NJDNode * node)
{
   NJDNode *next;

   if (node == njd->head && node == njd->tail) {
      njd->head = NULL;
      njd->tail = NULL;
      next = NULL;
   } else if (node == njd->head) {
      njd->head = node->next;
      njd->head->prev = NULL;
      next = njd->head;
   } else if (node == njd->tail) {
      njd->tail = node->prev;
      njd->tail->next = NULL;
      next = NULL;
   } else {
      node->prev->next = node->next;
      node->next->prev = node->prev;
      next = node->next;
   }
   NJDNode_clear(node);
   free(node);
   return next;
}